

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall
protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::Reset
          (HeapBuffered<perfetto::protos::pbzero::TracePacket> *this)

{
  uint64_t *puVar1;
  
  ScatteredHeapBuffer::Reset(&this->shb_);
  puVar1 = &(this->writer_).written_previously_;
  *puVar1 = (uint64_t)
            ((this->writer_).write_ptr_ + (*puVar1 - (long)(this->writer_).cur_range_.begin));
  (this->writer_).write_ptr_ = (uint8_t *)0x0;
  (this->writer_).cur_range_.begin = (uint8_t *)0x0;
  (this->writer_).cur_range_.end = (uint8_t *)0x0;
  RootMessage<perfetto::protos::pbzero::TracePacket>::Reset(&this->msg_,&this->writer_);
  return;
}

Assistant:

void Reset() {
    shb_.Reset();
    writer_.Reset(protozero::ContiguousMemoryRange{});
    msg_.Reset(&writer_);
    PERFETTO_DCHECK(empty());
  }